

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O0

void __thiscall
SubCircuit<0>::explainAcantreachB
          (SubCircuit<0> *this,Clause *reason,int reasonIndex,vec<int> *A,vec<int> *B,int a1,int b1)

{
  uint uVar1;
  Lit LVar2;
  int *piVar3;
  Lit *pLVar4;
  vec<int> *in_RCX;
  long in_RDI;
  vec<int> *in_R8;
  int in_R9D;
  int in_stack_00000008;
  uint b;
  uint a;
  int in_stack_ffffffffffffff8c;
  Clause *this_00;
  IntView<0> *this_01;
  uint local_34;
  uint local_30;
  
  local_30 = 0;
  do {
    uVar1 = vec<int>::size(in_RCX);
    if (uVar1 <= local_30) {
      return;
    }
    local_34 = 0;
    while( true ) {
      uVar1 = vec<int>::size(in_R8);
      if (uVar1 <= local_34) break;
      piVar3 = vec<int>::operator[](in_RCX,local_30);
      if (*piVar3 == in_R9D) {
        piVar3 = vec<int>::operator[](in_R8,local_34);
        if (*piVar3 != in_stack_00000008) goto LAB_001847cb;
      }
      else {
LAB_001847cb:
        this_00 = *(Clause **)(in_RDI + 0x18);
        piVar3 = vec<int>::operator[](in_RCX,local_30);
        this_01 = (IntView<0> *)(this_00 + (long)*piVar3 * 2);
        vec<int>::operator[](in_R8,local_34);
        IntView<0>::getLit(this_01,(int64_t)this_00,in_stack_ffffffffffffff8c);
        LVar2 = operator~((Lit)0x184828);
        pLVar4 = Clause::operator[](this_00,in_stack_ffffffffffffff8c);
        pLVar4->x = LVar2.x;
      }
      local_34 = local_34 + 1;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void explainAcantreachB(Clause* reason, int reasonIndex, vec<int> A, vec<int> B, int a1 = -1,
													int b1 = -1) {
		// fprintf(stderr, "explaining");
		for (unsigned int a = 0; a < A.size(); a++) {
			assert(A[a] < size && A[a] >= 0);
			for (unsigned int b = 0; b < B.size(); b++) {
				assert(B[b] < size && B[b] >= 0);
				if (A[a] != a1 || B[b] != b1) {
					assert(!x[A[a]].indomain(B[b]));
					// fprintf(stderr, "add %d not equal to %d\n", A[a], B[b]);
					(*reason)[reasonIndex++] = ~x[A[a]].getLit(B[b], LR_NE);
				}
			}
		}
		// fprintf(stderr, "done\n");
	}